

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::
join<char_const*&,char_const(&)[5],char_const*,char_const(&)[6],char_const*,char_const*&,char_const(&)[2],char_const*&,char_const*&,char_const*&,char_const(&)[8],char_const*,char_const(&)[16]>
          (string *__return_storage_ptr__,spirv_cross *this,char **ts,char (*ts_1) [5],char **ts_2,
          char (*ts_3) [6],char **ts_4,char **ts_5,char (*ts_6) [2],char **ts_7,char **ts_8,
          char **ts_9,char (*ts_10) [8],char **ts_11,char (*ts_12) [16])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::
  join_helper<char_const*&,char_const(&)[5],char_const*,char_const(&)[6],char_const*,char_const*&,char_const(&)[2],char_const*&,char_const*&,char_const*&,char_const(&)[8],char_const*,char_const(&)[16]>
            (&local_1120,(char **)this,(char (*) [5])ts,(char **)ts_1,(char (*) [6])ts_2,
             (char **)ts_3,ts_4,(char (*) [2])ts_5,(char **)ts_6,ts_7,ts_8,(char (*) [8])ts_9,
             (char **)ts_10,(char (*) [16])ts_11);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}